

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

LinkedModel * __thiscall CoreML::Specification::Model::mutable_linkedmodel(Model *this)

{
  bool bVar1;
  LinkedModel *this_00;
  Model *this_local;
  
  bVar1 = has_linkedmodel(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_linkedmodel(this);
    this_00 = (LinkedModel *)operator_new(0x20);
    LinkedModel::LinkedModel(this_00);
    (this->Type_).linkedmodel_ = this_00;
  }
  return (LinkedModel *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::LinkedModel* Model::mutable_linkedmodel() {
  if (!has_linkedmodel()) {
    clear_Type();
    set_has_linkedmodel();
    Type_.linkedmodel_ = new ::CoreML::Specification::LinkedModel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.linkedModel)
  return Type_.linkedmodel_;
}